

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O0

bool fillWAVESizes(FILE *outputFile,int numFrames,OUTPUT_SAMPLE_FORMAT outputSampleFormat)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int riffSize;
  int dataSize;
  int frameSize;
  OUTPUT_SAMPLE_FORMAT outputSampleFormat_local;
  int numFrames_local;
  FILE *outputFile_local;
  
  iVar3 = 4;
  if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
    iVar3 = 8;
  }
  uVar1 = numFrames * iVar3;
  uVar2 = uVar1 + 0x1c;
  iVar3 = fseek((FILE *)outputFile,4,0);
  if (iVar3 == 0) {
    iVar3 = fputc(uVar2 & 0xff,(FILE *)outputFile);
    if (iVar3 == -1) {
      outputFile_local._7_1_ = false;
    }
    else {
      iVar3 = fputc((int)uVar2 >> 8 & 0xff,(FILE *)outputFile);
      if (iVar3 == -1) {
        outputFile_local._7_1_ = false;
      }
      else {
        iVar3 = fputc((int)uVar2 >> 0x10 & 0xff,(FILE *)outputFile);
        if (iVar3 == -1) {
          outputFile_local._7_1_ = false;
        }
        else {
          iVar3 = fputc((int)uVar2 >> 0x18 & 0xff,(FILE *)outputFile);
          if (iVar3 == -1) {
            outputFile_local._7_1_ = false;
          }
          else {
            iVar3 = fseek((FILE *)outputFile,0x28,0);
            if (iVar3 == 0) {
              iVar3 = fputc(uVar1 & 0xff,(FILE *)outputFile);
              if (iVar3 == -1) {
                outputFile_local._7_1_ = false;
              }
              else {
                iVar3 = fputc((int)uVar1 >> 8 & 0xff,(FILE *)outputFile);
                if (iVar3 == -1) {
                  outputFile_local._7_1_ = false;
                }
                else {
                  iVar3 = fputc((int)uVar1 >> 0x10 & 0xff,(FILE *)outputFile);
                  if (iVar3 == -1) {
                    outputFile_local._7_1_ = false;
                  }
                  else {
                    iVar3 = fputc((int)uVar1 >> 0x18 & 0xff,(FILE *)outputFile);
                    if (iVar3 == -1) {
                      outputFile_local._7_1_ = false;
                    }
                    else {
                      outputFile_local._7_1_ = true;
                    }
                  }
                }
              }
            }
            else {
              outputFile_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  else {
    outputFile_local._7_1_ = false;
  }
  return outputFile_local._7_1_;
}

Assistant:

static bool fillWAVESizes(FILE *outputFile, int numFrames, OUTPUT_SAMPLE_FORMAT outputSampleFormat) {
	// FIXME: Check return codes, etc.
	const int frameSize = outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32 ? 8 : 4;
	int dataSize = numFrames * frameSize;
	int riffSize = dataSize + 28;
	if (fseek(outputFile, HEADEROFFS_RIFFLEN, SEEK_SET))
		return false;
	if (fputc(riffSize & 0xFF, outputFile) == EOF)
		return false;
	if (fputc((riffSize >> 8) & 0xFF, outputFile) == EOF)
		return false;
	if (fputc((riffSize >> 16) & 0xFF, outputFile) == EOF)
		return false;
	if (fputc((riffSize >> 24) & 0xFF, outputFile) == EOF)
		return false;
	if (fseek(outputFile, HEADEROFFS_DATALEN, SEEK_SET))
		return false;
	if (fputc(dataSize & 0xFF, outputFile) == EOF)
		return false;
	if (fputc((dataSize >> 8) & 0xFF, outputFile) == EOF)
		return false;
	if (fputc((dataSize >> 16) & 0xFF, outputFile) == EOF)
		return false;
	if (fputc((dataSize >> 24) & 0xFF, outputFile) == EOF)
		return false;
	return true;
}